

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastSmS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte *p;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ushort *puVar5;
  ulong uVar6;
  char *pcVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *pPVar9;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *extraout_RDX_02;
  size_t size_1;
  ulong uVar10;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 this;
  size_t size;
  char *pcVar11;
  char *pcVar12;
  uint *puVar13;
  string_view data_00;
  pair<const_char_*,_int> pVar14;
  string_view sVar15;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  this.data = (long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30);
  if ((this.data & 7) != 0) {
    AlignFail(this.data);
  }
  p = (byte *)(ptr + 2);
  uVar10 = (ulong)data.field_0 >> 0x10;
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  uVar2 = *(ushort *)ptr;
  bVar1 = *p;
  pcVar7 = (char *)(ulong)bVar1;
  uVar4 = (uint)bVar1;
  pPVar9 = ctx;
  if (arena.data == 0) {
    if ((char)bVar1 < '\0') {
      pVar14 = ReadSizeFallback((char *)p,(uint)bVar1);
      pPVar9 = pVar14._8_8_;
      pcVar12 = pVar14.first;
      uVar4 = pVar14.second;
    }
    else {
      pcVar12 = ptr + 3;
      pcVar7 = ptr;
    }
    if (pcVar12 != (char *)0x0) {
      iVar3 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,pcVar12);
      if (iVar3 < (int)uVar4) {
        arena.data = this.data;
        puVar5 = (ushort *)
                 EpsCopyInputStream::ReadMicroStringFallback
                           (&ctx->super_EpsCopyInputStream,pcVar12,uVar4,(MicroString *)this,
                            (Arena *)0x0);
        pPVar9 = extraout_RDX_01;
        pcVar7 = pcVar12;
      }
      else {
        pcVar11 = (char *)(long)(int)uVar4;
        arena.data = 0;
        sVar15._M_str = pcVar12;
        sVar15._M_len = (size_t)pcVar11;
        pcVar7 = pcVar11;
        MicroString::SetImpl((MicroString *)this,sVar15,(Arena *)0x0,7);
        puVar5 = (ushort *)(pcVar12 + (long)pcVar11);
        pPVar9 = extraout_RDX_02;
      }
      goto LAB_00285100;
    }
  }
  else {
    if ((char)bVar1 < '\0') {
      pVar14 = ReadSizeFallback((char *)p,(uint)bVar1);
      pPVar9 = pVar14._8_8_;
      pcVar12 = pVar14.first;
      uVar4 = pVar14.second;
    }
    else {
      pcVar12 = ptr + 3;
      pcVar7 = ptr;
    }
    if (pcVar12 != (char *)0x0) {
      iVar3 = EpsCopyInputStream::BytesAvailable(&ctx->super_EpsCopyInputStream,pcVar12);
      if (iVar3 < (int)uVar4) {
        aVar8.data = this.data;
        puVar5 = (ushort *)
                 EpsCopyInputStream::ReadMicroStringFallback
                           (&ctx->super_EpsCopyInputStream,pcVar12,uVar4,(MicroString *)this,
                            (Arena *)arena);
        arena = aVar8;
        pPVar9 = extraout_RDX;
        pcVar7 = pcVar12;
      }
      else {
        pcVar11 = (char *)(long)(int)uVar4;
        data_00._M_str = pcVar12;
        data_00._M_len = (size_t)pcVar11;
        pcVar7 = pcVar11;
        MicroString::SetImpl((MicroString *)this,data_00,(Arena *)arena,7);
        puVar5 = (ushort *)(pcVar12 + (long)pcVar11);
        pPVar9 = extraout_RDX_00;
      }
      goto LAB_00285100;
    }
  }
  puVar5 = (ushort *)0x0;
  arena = data.field_0;
LAB_00285100:
  uVar10 = hasbits | 1L << (uVar10 & 0x3f);
  if (puVar5 == (ushort *)0x0) {
    pcVar7 = Error(msg,pcVar7,pPVar9,(TcFieldData)arena,table,uVar10);
    return pcVar7;
  }
  sVar15 = MicroString::Get((MicroString *)this);
  iVar3 = utf8_range_IsValid(sVar15._M_str,sVar15._M_len);
  if (iVar3 == 0) {
    ReportFastUtf8Error((int)(char)uVar2 + (uint)uVar2 >> 1,table);
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar5) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar13 & 3) != 0) {
        AlignFail(puVar13);
      }
      *puVar13 = *puVar13 | (uint)uVar10;
    }
    return (char *)puVar5;
  }
  uVar4 = (uint)table->fast_idx_mask & (uint)*puVar5;
  if ((uVar4 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar6 = (ulong)(uVar4 & 0xfffffff8);
  pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar6))
                             (msg,puVar5,ctx,
                              (ulong)*puVar5 ^ *(ulong *)(&table[1].fast_idx_mask + uVar6 * 2),table
                              ,uVar10);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSmS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint16_t, MicroString,
                                          kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}